

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsavefile.cpp
# Opt level: O0

void __thiscall QSaveFilePrivate::~QSaveFilePrivate(QSaveFilePrivate *this)

{
  QSaveFilePrivate *in_RDI;
  
  ~QSaveFilePrivate(in_RDI);
  operator_delete(in_RDI,0x1e0);
  return;
}

Assistant:

QSaveFilePrivate::~QSaveFilePrivate()
{
}